

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O0

int configConv(mpt_convertable *val,uintptr_t type,void *ptr)

{
  mpt_node *pmVar1;
  mpt_configRoot *c;
  void *ptr_local;
  uintptr_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr == (void *)0x0) {
      val_local._4_4_ = 0x85;
    }
    else {
      *(uint8_t **)ptr = configConv::fmt;
      val_local._4_4_ = 0;
    }
  }
  else if (type == 0x85) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 9;
  }
  else if (type == 9) {
    if (val[4]._vptr == (_mpt_vptr_convertable *)0x0) {
      val_local._4_4_ = -2;
    }
    else {
      if (ptr != (void *)0x0) {
        pmVar1 = make_global((mpt_path *)(val + 2));
        *(mpt_node **)ptr = pmVar1;
      }
      val_local._4_4_ = 0x85;
    }
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int configConv(MPT_INTERFACE(convertable) *val, uintptr_t type, void *ptr)
{
	const MPT_STRUCT(configRoot) *c = (void *) val;
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeConfigPtr), MPT_ENUM(TypeNodePtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeConfigPtr);
	}
	if (type == MPT_ENUM(TypeConfigPtr)) {
		if (ptr) *((const void **) ptr) = &c->_cfg;
		return MPT_ENUM(TypeNodePtr);
	}
	if (type == MPT_ENUM(TypeNodePtr)) {
		if (!c->base.len) {
			return MPT_ERROR(BadValue);
		}
		if (ptr) {
			*((void **) ptr) = make_global(&c->base);
		}
		return MPT_ENUM(TypeConfigPtr);
	}
	return MPT_ERROR(BadType);
}